

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  bool bVar1;
  Tables *pTVar2;
  Symbol SVar3;
  undefined4 uStack_64;
  FileDescriptor *file_result;
  undefined1 auStack_48 [8];
  Symbol result;
  MutexLockMaybe local_28;
  MutexLockMaybe lock;
  string *symbol_name_local;
  DescriptorPool *this_local;
  
  lock.mu_ = (Mutex *)symbol_name;
  internal::MutexLockMaybe::MutexLockMaybe(&local_28,this->mutex_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(pTVar2->known_bad_symbols_).
           super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(pTVar2->known_bad_files_).
           super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         );
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  SVar3 = Tables::FindSymbol(pTVar2,(string *)lock.mu_);
  result._0_8_ = SVar3.field_1;
  auStack_48._0_4_ = SVar3.type;
  bVar1 = Symbol::IsNull((Symbol *)auStack_48);
  if (bVar1) {
    if ((this->underlay_ == (DescriptorPool *)0x0) ||
       (this_local = (DescriptorPool *)FindFileContainingSymbol(this->underlay_,(string *)lock.mu_),
       this_local == (DescriptorPool *)0x0)) {
      bVar1 = TryFindSymbolInFallbackDatabase(this,(string *)lock.mu_);
      if (bVar1) {
        pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                           (&this->tables_);
        SVar3 = Tables::FindSymbol(pTVar2,(string *)lock.mu_);
        result._0_8_ = SVar3.field_1;
        auStack_48._4_4_ = uStack_64;
        auStack_48._0_4_ = SVar3.type;
        bVar1 = Symbol::IsNull((Symbol *)auStack_48);
        if (!bVar1) {
          this_local = (DescriptorPool *)Symbol::GetFile((Symbol *)auStack_48);
          goto LAB_00a72bd0;
        }
      }
      this_local = (DescriptorPool *)0x0;
    }
  }
  else {
    this_local = (DescriptorPool *)Symbol::GetFile((Symbol *)auStack_48);
  }
LAB_00a72bd0:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_28);
  return (FileDescriptor *)this_local;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != NULL) {
    const FileDescriptor* file_result =
      underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != NULL) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return NULL;
}